

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall
rsg::IntLiteral::IntLiteral(IntLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  deUint32 dVar4;
  VariableType *type;
  long lVar5;
  int iVar6;
  int iVar7;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__IntLiteral_00786718;
  type = VariableType::getScalarType(TYPE_INT);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
  local_80.m_baseType = TYPE_INT;
  local_80.m_precision = PRECISION_NONE;
  local_80.m_typeName._M_string_length = 0;
  local_80.m_typeName.field_2._M_local_buf[0] = '\0';
  local_80.m_numElements = 1;
  local_80.m_elementType = (VariableType *)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = VariableType::operator==(valueRange.m_type,&local_80);
  VariableType::~VariableType(&local_80);
  if (bVar3) {
    VariableType::getElementType(valueRange.m_type);
    iVar6 = (valueRange.m_min)->intVal;
    VariableType::getElementType(valueRange.m_type);
    iVar7 = 0x10;
    if ((valueRange.m_max)->intVal != 0x7fffffff) {
      iVar7 = (valueRange.m_max)->intVal;
    }
  }
  else {
    iVar6 = -0x10;
    iVar7 = 0x10;
  }
  dVar4 = deRandom_getUint32(&state->m_random->m_rnd);
  VariableType::getScalarType(TYPE_INT);
  lVar5 = 0;
  iVar6 = dVar4 % ((iVar7 - iVar6) + 1U) + iVar6;
  pSVar2 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    pSVar1 = pSVar2 + lVar5;
    pSVar1->intVal = iVar6;
    pSVar1[1].intVal = iVar6;
    pSVar1[2].intVal = iVar6;
    pSVar1[3].intVal = iVar6;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x40);
  return;
}

Assistant:

IntLiteral::IntLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_INT))
{
	int minVal = -16;
	int maxVal = +16;

	if (valueRange.getType() == VariableType(VariableType::TYPE_INT, 1))
	{
		minVal = valueRange.getMin().component(0).asInt();
		maxVal = valueRange.getMax().component(0).asInt();

		if (Scalar::min<int>() == minVal)
			minVal = -16;

		if (Scalar::max<int>() == maxVal)
			maxVal = 16;
	}

	int				value	= state.getRandom().getInt(minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_INT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asInt(ndx) = value;
}